

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_importtype_t::wasm_importtype_t(wasm_importtype_t *this,wasm_importtype_t *other)

{
  pointer pcVar1;
  pointer *__ptr;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Head_base<0UL,_wabt::interp::ExternType_*,_false> local_38;
  
  pcVar1 = (other->I).module._M_dataplus._M_p;
  local_78._0_8_ = local_78 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + (other->I).module._M_string_length);
  pcVar1 = (other->I).name._M_dataplus._M_p;
  local_58._M_p = (pointer)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (other->I).name._M_string_length);
  (*((other->I).type._M_t.
     super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
     ._M_t.
     super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
     .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl)->_vptr_ExternType[2])
            (&local_38);
  wasm_importtype_t(this,(ImportType *)local_78);
  if (local_38._M_head_impl != (ExternType *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ExternType[1])();
  }
  local_38._M_head_impl = (ExternType *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return;
}

Assistant:

wasm_importtype_t(const wasm_importtype_t& other)
      : wasm_importtype_t(other.I) {}